

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

void Abc_NtkRecAdd3(Abc_Ntk_t *pNtk,int fUseSOPB)

{
  int iVar1;
  abctime aVar2;
  Abc_Ntk_t *pNtk_00;
  abctime aVar3;
  bool bVar4;
  int clk;
  Abc_Ntk_t *pNtkNew;
  If_Par_t *pPars;
  If_Par_t Pars;
  int fUseSOPB_local;
  Abc_Ntk_t *pNtk_local;
  
  Pars.pReoMan._4_4_ = fUseSOPB;
  aVar2 = Abc_Clock();
  iVar1 = Abc_NtkGetChoiceNum(pNtk);
  if (iVar1 != 0) {
    printf("Performing recoding structures with choices.\n");
  }
  s_pMan3->fLibConstr = 1;
  if ((s_pMan3->pGia != (Gia_Man_t *)0x0) && (s_pMan3->pGia->pHTable == (int *)0x0)) {
    Gia_ManHashStart(s_pMan3->pGia);
  }
  memset((If_Par_t *)&pPars,0,0x130);
  pPars._0_4_ = s_pMan3->nVars;
  pPars._4_4_ = s_pMan3->nCuts;
  Pars.nGateSize = -0x40800000;
  Pars.nNonDecLimit = 0x3ba3d70a;
  Pars.nAndArea = 1;
  bVar4 = Pars.pReoMan._4_4_ == 0;
  Pars.fAreaOnly = (int)!bVar4;
  Pars.fSkipCutFilter = 1;
  Pars.fPower = (int)!bVar4;
  Pars.fEdge = (int)bVar4;
  Pars.pLutStruct._4_4_ = 0;
  Pars.pTimesReq = (float *)0x0;
  Pars.pFuncCost = Abc_NtkRecAddCut3;
  pNtk_00 = Abc_NtkIf(pNtk,(If_Par_t *)&pPars);
  Abc_NtkDelete(pNtk_00);
  aVar3 = Abc_Clock();
  s_pMan3->timeTotal = (aVar3 - (int)aVar2) + s_pMan3->timeTotal;
  return;
}

Assistant:

void Abc_NtkRecAdd3( Abc_Ntk_t * pNtk, int fUseSOPB )
{
    extern Abc_Ntk_t * Abc_NtkIf( Abc_Ntk_t * pNtk, If_Par_t * pPars );
    If_Par_t Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtkNew;
    int clk = Abc_Clock();
    if ( Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Performing recoding structures with choices.\n" );
    // remember that the manager was used for library construction
    s_pMan3->fLibConstr = 1;
    // create hash table if not available
    if ( s_pMan3->pGia && s_pMan3->pGia->pHTable == NULL )
        Gia_ManHashStart( s_pMan3->pGia );

    // set defaults
    memset( pPars, 0, sizeof(If_Par_t) );
    // user-controlable paramters
    pPars->nLutSize    =  s_pMan3->nVars;
    pPars->nCutsMax    =  s_pMan3->nCuts;
    pPars->DelayTarget = -1;
    pPars->Epsilon     =  (float)0.005;
    pPars->fArea       =  1;
    // internal parameters
    if ( fUseSOPB )
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  0;
        pPars->fUsePerm    =  1; 
        pPars->fDelayOpt   =  1;
    }
    else
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  1;
        pPars->fUsePerm    =  0; 
        pPars->fDelayOpt   =  0;
    }
    pPars->fSkipCutFilter = 0;
    pPars->pFuncCost   =  NULL;
    pPars->pFuncUser   =  Abc_NtkRecAddCut3;
    // perform recording
    pNtkNew = Abc_NtkIf( pNtk, pPars );
    Abc_NtkDelete( pNtkNew );
s_pMan3->timeTotal += Abc_Clock() - clk;
}